

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O2

void __thiscall yactfr::internal::TraceTypeImpl::_setDispNames(TraceTypeImpl *this)

{
  StructureType *this_00;
  long lVar1;
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *psVar2;
  sockaddr *extraout_RDX_03;
  int __fd;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  SetDispNamesDtVisitor visitor;
  undefined **local_38;
  undefined1 local_30;
  
  local_30 = this->_majorVersion == 1;
  local_38 = &PTR__DataTypeVisitor_00362108;
  this_00 = (this->_pktHeaderType)._M_t.
            super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
            .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl;
  __fd = (int)&local_38;
  if (this_00 != (StructureType *)0x0) {
    DataType::accept((DataType *)this_00,__fd,in_RDX,in_RCX);
    in_RDX = extraout_RDX;
  }
  auVar7._8_8_ = in_RDX;
  auVar7._0_8_ = (this->_dsts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (psVar2 = auVar7._8_8_, p_Var5 = auVar7._0_8_,
        (_Rb_tree_header *)p_Var5 != &(this->_dsts)._M_t._M_impl.super__Rb_tree_header) {
    lVar4 = *(long *)(p_Var5 + 1);
    if (*(DataType **)(lVar4 + 0xe8) != (DataType *)0x0) {
      DataType::accept(*(DataType **)(lVar4 + 0xe8),__fd,psVar2,in_RCX);
      lVar4 = *(long *)(p_Var5 + 1);
      psVar2 = extraout_RDX_00;
    }
    if (*(DataType **)(lVar4 + 0xf0) != (DataType *)0x0) {
      DataType::accept(*(DataType **)(lVar4 + 0xf0),__fd,psVar2,in_RCX);
      lVar4 = *(long *)(p_Var5 + 1);
      psVar2 = extraout_RDX_01;
    }
    if (*(DataType **)(lVar4 + 0xf8) != (DataType *)0x0) {
      DataType::accept(*(DataType **)(lVar4 + 0xf8),__fd,psVar2,in_RCX);
      lVar4 = *(long *)(p_Var5 + 1);
      psVar2 = extraout_RDX_02;
    }
    auVar6._8_8_ = psVar2;
    auVar6._0_8_ = *(undefined8 *)(lVar4 + 0x98);
    while (psVar2 = auVar6._8_8_, p_Var3 = auVar6._0_8_,
          p_Var3 != (_Rb_tree_node_base *)(lVar4 + 0x88)) {
      lVar1 = *(long *)(p_Var3 + 1);
      if (*(DataType **)(lVar1 + 0xb8) != (DataType *)0x0) {
        DataType::accept(*(DataType **)(lVar1 + 0xb8),__fd,psVar2,in_RCX);
        lVar1 = *(long *)(p_Var3 + 1);
        psVar2 = extraout_RDX_03;
      }
      if (*(DataType **)(lVar1 + 0xc0) != (DataType *)0x0) {
        DataType::accept(*(DataType **)(lVar1 + 0xc0),__fd,psVar2,in_RCX);
      }
      auVar6 = std::_Rb_tree_increment(p_Var3);
    }
    auVar7 = std::_Rb_tree_increment(p_Var5);
  }
  return;
}

Assistant:

void TraceTypeImpl::_setDispNames() const
{
    SetDispNamesDtVisitor visitor {_majorVersion == 1};

    if (_pktHeaderType) {
        _pktHeaderType->accept(visitor);
    }

    for (auto& dst : _dsts) {
        if (dst->packetContextType()) {
            dst->packetContextType()->accept(visitor);
        }

        if (dst->eventRecordHeaderType()) {
            dst->eventRecordHeaderType()->accept(visitor);
        }

        if (dst->eventRecordCommonContextType()) {
            dst->eventRecordCommonContextType()->accept(visitor);
        }

        for (auto& ert : dst->eventRecordTypes()) {
            if (ert->specificContextType()) {
                ert->specificContextType()->accept(visitor);
            }

            if (ert->payloadType()) {
                ert->payloadType()->accept(visitor);
            }
        }
    }
}